

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-async-null-cb.c
# Opt level: O3

int run_test_async_null_cb(void)

{
  int iVar1;
  int extraout_EAX;
  undefined8 uVar2;
  
  async_handle.queue[1]._0_4_ = 0xffffffff;
  async_handle.queue[1]._4_4_ = 0xffffffff;
  async_handle.pending = -1;
  async_handle._124_4_ = 0xffffffff;
  async_handle.async_cb._0_4_ = 0xffffffff;
  async_handle.async_cb._4_4_ = 0xffffffff;
  async_handle.queue[0]._0_4_ = 0xffffffff;
  async_handle.queue[0]._4_4_ = 0xffffffff;
  async_handle.next_closing._0_4_ = 0xffffffff;
  async_handle.next_closing._4_4_ = 0xffffffff;
  async_handle.flags = 0xffffffff;
  async_handle._92_4_ = 0xffffffff;
  async_handle.u._16_4_ = 0xffffffff;
  async_handle.u._20_4_ = 0xffffffff;
  async_handle.u._24_4_ = 0xffffffff;
  async_handle.u._28_4_ = 0xffffffff;
  async_handle.u.fd = -1;
  async_handle.u._4_4_ = 0xffffffff;
  async_handle.u._8_4_ = 0xffffffff;
  async_handle.u._12_4_ = 0xffffffff;
  async_handle.handle_queue[0]._0_4_ = 0xffffffff;
  async_handle.handle_queue[0]._4_4_ = 0xffffffff;
  async_handle.handle_queue[1]._0_4_ = 0xffffffff;
  async_handle.handle_queue[1]._4_4_ = 0xffffffff;
  async_handle.type = ~UV_UNKNOWN_HANDLE;
  async_handle._20_4_ = 0xffffffff;
  async_handle.close_cb._0_4_ = 0xffffffff;
  async_handle.close_cb._4_4_ = 0xffffffff;
  async_handle.data._0_4_ = 0xffffffff;
  async_handle.data._4_4_ = 0xffffffff;
  async_handle.loop._0_4_ = 0xffffffff;
  async_handle.loop._4_4_ = 0xffffffff;
  uVar2 = uv_default_loop();
  iVar1 = uv_async_init(uVar2,&async_handle,0);
  if (iVar1 == 0) {
    uVar2 = uv_default_loop();
    iVar1 = uv_check_init(uVar2,&check_handle);
    if (iVar1 != 0) goto LAB_0014c19f;
    iVar1 = uv_check_start(&check_handle,check_cb);
    if (iVar1 != 0) goto LAB_0014c1a4;
    iVar1 = uv_thread_create(&thread,thread_cb,0);
    if (iVar1 != 0) goto LAB_0014c1a9;
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,0);
    if (iVar1 != 0) goto LAB_0014c1ae;
    iVar1 = uv_thread_join(&thread);
    if (iVar1 != 0) goto LAB_0014c1b3;
    if (check_cb_called == 1) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0014c1bd;
    }
  }
  else {
    run_test_async_null_cb_cold_1();
LAB_0014c19f:
    run_test_async_null_cb_cold_2();
LAB_0014c1a4:
    run_test_async_null_cb_cold_3();
LAB_0014c1a9:
    run_test_async_null_cb_cold_4();
LAB_0014c1ae:
    run_test_async_null_cb_cold_5();
LAB_0014c1b3:
    run_test_async_null_cb_cold_6();
  }
  run_test_async_null_cb_cold_7();
LAB_0014c1bd:
  run_test_async_null_cb_cold_8();
  if (check_cb_called == 0) {
    uv_close(&async_handle,0);
    uv_close(&check_handle,0);
    check_cb_called = check_cb_called + 1;
    return extraout_EAX;
  }
  check_cb_cold_1();
  iVar1 = uv_async_send(&async_handle);
  return iVar1;
}

Assistant:

TEST_IMPL(async_null_cb) {
  /*
   * Fill async_handle with garbage values.
   * uv_async_init() should properly initialize struct fields regardless of
   * initial values.
   * This is added to verify paddings between fields do not affect behavior.
   */
  memset(&async_handle, 0xff, sizeof(async_handle));

  ASSERT(0 == uv_async_init(uv_default_loop(), &async_handle, NULL));
  ASSERT(0 == uv_check_init(uv_default_loop(), &check_handle));
  ASSERT(0 == uv_check_start(&check_handle, check_cb));
  ASSERT(0 == uv_thread_create(&thread, thread_cb, NULL));
  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  ASSERT(0 == uv_thread_join(&thread));
  ASSERT(1 == check_cb_called);
  MAKE_VALGRIND_HAPPY();
  return 0;
}